

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,TrackJamTargetIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Site:        ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Application: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Entity:      ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Emitter ID:  ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Beam ID:     ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString TrackJamTargetIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << m_ui16SiteID              << "\n"
       << "Application: " << m_ui16ApplicationID       << "\n"
       << "Entity:      " << m_ui16EntityID            << "\n"
       << "Emitter ID:  " << ( KUINT16 )m_ui8EmitterID << "\n"
       << "Beam ID:     " << ( KUINT16 )m_ui8BeamID    << "\n";

    return ss.str();
}